

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O3

void cleanUpExecutedProcess
               (ProcessDelegate *delegate,ProcessGroup *pgrp,llbuild_pid_t pid,ProcessHandle handle,
               ProcessContext *ctx,ProcessCompletionFn *completionFn,ManagedDescriptor *releaseFd)

{
  int iVar1;
  Child CVar2;
  Child CVar3;
  ProcessDelegate *pPVar4;
  ProcessContext *pPVar5;
  uint64_t uVar6;
  __pid_t _Var7;
  int *piVar8;
  char *Str;
  NodeKind LHSKind;
  uint uVar9;
  Child CVar10;
  Child CVar11;
  ProcessResult processResult;
  rusage usage;
  uint local_19c;
  Child local_198 [2];
  undefined8 local_188;
  ProcessDelegate *local_178;
  ProcessContext *local_170;
  uint64_t local_168;
  _Any_data *local_160;
  Child local_158;
  undefined8 uStack_150;
  long local_148;
  long lStack_140;
  long local_138;
  undefined4 local_130;
  undefined4 uStack_12c;
  NodeKind local_120;
  char cStack_11f;
  undefined6 uStack_11e;
  uint local_118;
  undefined4 uStack_114;
  NodeKind local_108;
  char cStack_107;
  undefined6 uStack_106;
  uint local_100;
  undefined4 uStack_fc;
  NodeKind local_f0;
  char cStack_ef;
  undefined6 uStack_ee;
  ProcessStatus local_e8;
  uint uStack_e4;
  llbuild_pid_t lStack_e0;
  undefined4 uStack_dc;
  long local_d8;
  long lStack_d0;
  long local_c8;
  rusage local_c0;
  
  local_178 = delegate;
  local_170 = ctx;
  local_168 = handle.id;
  local_160 = (_Any_data *)completionFn;
  _Var7 = wait4(pid,&local_19c,0,&local_c0);
  if (_Var7 == -1) {
    piVar8 = __errno_location();
    do {
      if (*piVar8 != 4) {
        iVar1 = releaseFd->_descriptor;
        if (-1 < iVar1) {
          releaseFd->_descriptor = -1;
          releaseFd->_closedProperly = true;
          llbuild::basic::sys::close(iVar1);
        }
        llbuild::basic::ProcessGroup::remove(pgrp,(char *)(ulong)(uint)pid);
        local_e8 = Failed;
        uStack_e4 = local_19c;
        lStack_e0 = -1;
        local_d8 = 0;
        lStack_d0 = 0;
        local_c8 = 0;
        llvm::Twine::Twine((Twine *)&local_100,"unable to wait for process (");
        Str = strerror(*piVar8);
        llvm::Twine::Twine((Twine *)&local_118,Str);
        if ((local_f0 == NullKind) || (local_108 == NullKind)) {
          local_188 = CONCAT62(local_188._2_6_,0x100);
        }
        else if (local_f0 == EmptyKind) {
          local_188 = CONCAT62(uStack_106,CONCAT11(cStack_107,local_108));
          local_198[0]._0_4_ = local_118;
          local_198[0]._4_4_ = uStack_114;
        }
        else if (local_108 == EmptyKind) {
          local_188 = CONCAT62(uStack_ee,CONCAT11(cStack_ef,local_f0));
          local_198[0]._0_4_ = local_100;
          local_198[0]._4_4_ = uStack_fc;
        }
        else {
          CVar11._4_4_ = uStack_fc;
          CVar11.decUI = local_100;
          if (cStack_ef != '\x01') {
            local_f0 = TwineKind;
            CVar11.twine = (Twine *)&local_100;
          }
          if (cStack_107 != '\x01') {
            local_108 = TwineKind;
          }
          CVar3._4_4_ = uStack_114;
          CVar3.decUI = local_118;
          CVar10.twine = (Twine *)&local_118;
          if (cStack_107 == '\x01') {
            CVar10 = CVar3;
          }
          llvm::Twine::Twine((Twine *)local_198,CVar11,local_f0,CVar10,local_108);
        }
        llvm::Twine::Twine((Twine *)&local_130,")");
        if (((NodeKind)local_188 == NullKind) || (local_120 == NullKind)) {
          local_148 = CONCAT62(local_148._2_6_,0x100);
        }
        else if ((NodeKind)local_188 == EmptyKind) {
          local_148 = CONCAT62(uStack_11e,CONCAT11(cStack_11f,local_120));
        }
        else if (local_120 == EmptyKind) {
          local_148 = local_188;
        }
        else {
          CVar10._4_4_ = local_198[0]._4_4_;
          CVar10.decUI = local_198[0].decUI;
          LHSKind = (NodeKind)local_188;
          if (local_188._1_1_ != '\x01') {
            CVar10.twine = (Twine *)local_198;
            LHSKind = TwineKind;
          }
          if (cStack_11f != '\x01') {
            local_120 = TwineKind;
          }
          CVar2._4_4_ = uStack_12c;
          CVar2.decUI = local_130;
          CVar11.twine = (Twine *)&local_130;
          if (cStack_11f == '\x01') {
            CVar11 = CVar2;
          }
          llvm::Twine::Twine((Twine *)&local_158,CVar10,LHSKind,CVar11,local_120);
        }
        uVar6 = local_168;
        pPVar5 = local_170;
        pPVar4 = local_178;
        (*local_178->_vptr_ProcessDelegate[3])(local_178,local_170,local_168,&local_158);
        (*pPVar4->_vptr_ProcessDelegate[5])(pPVar4,pPVar5,uVar6,&local_e8);
        local_158._4_4_ = uStack_e4;
        local_158.decUI = local_e8;
        uStack_150 = CONCAT44(uStack_dc,lStack_e0);
        goto LAB_00152166;
      }
      _Var7 = wait4(pid,&local_19c,0,&local_c0);
    } while (_Var7 == -1);
  }
  iVar1 = releaseFd->_descriptor;
  if (-1 < iVar1) {
    releaseFd->_descriptor = -1;
    releaseFd->_closedProperly = true;
    llbuild::basic::sys::close(iVar1);
  }
  llbuild::basic::ProcessGroup::remove(pgrp,(char *)(ulong)(uint)pid);
  local_d8 = local_c0.ru_utime.tv_sec * 1000000 + local_c0.ru_utime.tv_usec;
  lStack_d0 = local_c0.ru_stime.tv_sec * 1000000 + local_c0.ru_stime.tv_usec;
  uVar9 = local_19c & 0x7f;
  if (((int)(uVar9 * 0x1000000 + 0x1000000) < 0x2000000) ||
     ((local_e8 = Cancelled, uVar9 != 2 && (uVar9 != 9)))) {
    local_e8 = (ProcessStatus)(local_19c != 0);
  }
  uStack_e4 = local_19c;
  local_c8 = local_c0.ru_maxrss;
  lStack_e0 = pid;
  (*local_178->_vptr_ProcessDelegate[5])(local_178,local_170,local_168,&local_e8);
  local_158._4_4_ = uStack_e4;
  local_158.decUI = local_e8;
  uStack_150 = CONCAT44(uStack_dc,lStack_e0);
LAB_00152166:
  local_148 = local_d8;
  lStack_140 = lStack_d0;
  local_138 = local_c8;
  if (*(long *)(local_160 + 1) != 0) {
    (**(code **)((long)local_160 + 0x18))(local_160,(ProcessResult *)&local_158);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

static void cleanUpExecutedProcess(ProcessDelegate& delegate,
                                   ProcessGroup& pgrp, llbuild_pid_t pid,
                                   ProcessHandle handle, ProcessContext* ctx,
                                   ProcessCompletionFn&& completionFn,
                                   ManagedDescriptor& releaseFd) {
#if defined(_WIN32)
  FILETIME creationTime;
  FILETIME exitTime;
  FILETIME utimeTicks;
  FILETIME stimeTicks;
  int waitResult = WaitForSingleObject(pid, INFINITE);
  int err = GetLastError();
  DWORD exitCode = 0;
  GetExitCodeProcess(pid, &exitCode);

  if (waitResult == WAIT_FAILED || waitResult == WAIT_ABANDONED) {
    releaseFd.close();
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }
#else
  // Wait for the command to complete.
  struct rusage usage;
  int exitCode, result = wait4(pid, &exitCode, 0, &usage);
  while (result == -1 && errno == EINTR)
    result = wait4(pid, &exitCode, 0, &usage);
#endif
  // Close the release pipe
  //
  // Note: We purposely hold this open until after the process has finished as
  // it simplifies client implentation. If we close it early, clients need to be
  // aware of and potentially handle a SIGPIPE.
  releaseFd.close();

  // Update the set of spawned processes.
  pgrp.remove(pid);
#if defined(_WIN32)
  PROCESS_MEMORY_COUNTERS counters;
  bool res =
      GetProcessTimes(pid, &creationTime, &exitTime, &stimeTicks, &utimeTicks);
  if (!res) {
    auto result = ProcessResult::makeCancelled();
    delegate.processHadError(ctx, handle,
                             Twine("unable to get statistics for process: ") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    return;
  }
  // Each tick is 100ns
  uint64_t utime =
      ((uint64_t)utimeTicks.dwHighDateTime << 32 | utimeTicks.dwLowDateTime) /
      10;
  uint64_t stime =
      ((uint64_t)stimeTicks.dwHighDateTime << 32 | stimeTicks.dwLowDateTime) /
      10;
  GetProcessMemoryInfo(pid, &counters, sizeof(counters));

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  ProcessStatus processStatus =
      (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              counters.PeakWorkingSetSize);
#else  // !defined(_WIN32)
  if (result == -1) {
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 strerror(errno) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes
  uint64_t utime = (uint64_t(usage.ru_utime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_utime.tv_usec));
  uint64_t stime = (uint64_t(usage.ru_stime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_stime.tv_usec));

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  bool cancelled = WIFSIGNALED(exitCode) && (WTERMSIG(exitCode) == SIGINT || WTERMSIG(exitCode) == SIGKILL);
  ProcessStatus processStatus = cancelled ? ProcessStatus::Cancelled : (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              usage.ru_maxrss);
#endif // else !defined(_WIN32)
  delegate.processFinished(ctx, handle, processResult);
  completionFn(processResult);
}